

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farchive.cpp
# Opt level: O2

FArchive * __thiscall
FArchive::SerializePointer(FArchive *this,void *ptrbase,BYTE **ptr,DWORD elemSize)

{
  DWORD DVar1;
  
  if (this->m_Storing == true) {
    if (*ptr == (BYTE *)0x0) {
      DVar1 = 0xffffffff;
    }
    else {
      DVar1 = (DWORD)((ulong)((long)*ptr - (long)ptrbase) / (ulong)elemSize);
    }
    WriteCount(this,DVar1);
  }
  else {
    DVar1 = ReadCount(this);
    if (DVar1 == 0xffffffff) {
      *ptr = (BYTE *)0x0;
    }
    else {
      *ptr = (BYTE *)((long)ptrbase + (ulong)(DVar1 * elemSize));
    }
  }
  return this;
}

Assistant:

FArchive &FArchive::SerializePointer (void *ptrbase, BYTE **ptr, DWORD elemSize)
{
	DWORD w;

	if (m_Storing)
	{
		if (*(void **)ptr)
		{
			w = DWORD(((size_t)*ptr - (size_t)ptrbase) / elemSize);
		}
		else
		{
			w = ~0u;
		}
		WriteCount (w);
	}
	else
	{
		w = ReadCount ();
		if (w != ~0u)
		{
			*(void **)ptr = (BYTE *)ptrbase + w * elemSize;
		}
		else
		{
			*(void **)ptr = NULL;
		}
	}
	return *this;
}